

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cpp
# Opt level: O0

void CheapTrick(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               CheapTrickOption *option,double **spectrogram)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *spectral_envelope_00;
  double dVar3;
  double local_128;
  int local_120;
  int local_11c;
  int j;
  int i;
  double current_f0;
  InverseRealFFT inverse_real_fft;
  ForwardRealFFT forward_real_fft;
  double *spectral_envelope;
  double f0_floor;
  RandnState randn_state;
  int fft_size;
  int f0_length_local;
  double *f0_local;
  double *temporal_positions_local;
  int fs_local;
  int x_length_local;
  double *x_local;
  
  randn_state.g_randn_z = option->fft_size;
  randn_state.g_randn_w = f0_length;
  memset(&f0_floor,0,0x10);
  randn_reseed((RandnState *)&f0_floor);
  dVar3 = GetF0FloorForCheapTrick(fs,randn_state.g_randn_z);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)randn_state.g_randn_z;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  spectral_envelope_00 = (double *)operator_new__(uVar2);
  memset(&inverse_real_fft.inverse_fft.w,0,0x60);
  InitializeForwardRealFFT(randn_state.g_randn_z,(ForwardRealFFT *)&inverse_real_fft.inverse_fft.w);
  memset(&current_f0,0,0x60);
  InitializeInverseRealFFT(randn_state.g_randn_z,(InverseRealFFT *)&current_f0);
  for (local_11c = 0; local_11c < (int)randn_state.g_randn_w; local_11c = local_11c + 1) {
    if (dVar3 < f0[local_11c]) {
      local_128 = f0[local_11c];
    }
    else {
      local_128 = 500.0;
    }
    anon_unknown.dwarf_be5::CheapTrickGeneralBody
              (x,x_length,fs,local_128,randn_state.g_randn_z,temporal_positions[local_11c],
               option->q1,(ForwardRealFFT *)&inverse_real_fft.inverse_fft.w,
               (InverseRealFFT *)&current_f0,spectral_envelope_00,(RandnState *)&f0_floor);
    for (local_120 = 0; local_120 <= (int)randn_state.g_randn_z / 2; local_120 = local_120 + 1) {
      spectrogram[local_11c][local_120] = spectral_envelope_00[local_120];
    }
  }
  DestroyForwardRealFFT((ForwardRealFFT *)&inverse_real_fft.inverse_fft.w);
  DestroyInverseRealFFT((InverseRealFFT *)&current_f0);
  if (spectral_envelope_00 != (double *)0x0) {
    operator_delete__(spectral_envelope_00);
  }
  return;
}

Assistant:

void CheapTrick(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    const CheapTrickOption *option, double **spectrogram) {
  int fft_size = option->fft_size;

  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double f0_floor = GetF0FloorForCheapTrick(fs, fft_size);
  double *spectral_envelope = new double[fft_size];

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);

  double current_f0;
  for (int i = 0; i < f0_length; ++i) {
    current_f0 = f0[i] <= f0_floor ? world::kDefaultF0 : f0[i];
    CheapTrickGeneralBody(x, x_length, fs, current_f0, fft_size,
        temporal_positions[i], option->q1, &forward_real_fft,
        &inverse_real_fft, spectral_envelope, &randn_state);
    for (int j = 0; j <= fft_size / 2; ++j)
      spectrogram[i][j] = spectral_envelope[j];
  }

  DestroyForwardRealFFT(&forward_real_fft);
  DestroyInverseRealFFT(&inverse_real_fft);
  delete[] spectral_envelope;
}